

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_printer.c
# Opt level: O3

void flatcc_json_printer_char_array_struct_field
               (flatcc_json_printer_t *ctx,int index,void *p,size_t offset,char *name,size_t len,
               size_t count)

{
  bool bVar1;
  char *pcVar2;
  size_t __n;
  char *__dest;
  byte c;
  ulong __n_00;
  ulong uVar3;
  byte *__src;
  byte *pbVar4;
  byte *pbVar5;
  
  if (index != 0) {
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + 1;
    *pcVar2 = ',';
  }
  __src = (byte *)((long)p + offset);
  print_name(ctx,name,len);
  if (count != 0) {
    do {
      if (__src[count - 1] != 0) goto LAB_001273dd;
      count = count - 1;
    } while (count != 0);
  }
  count = 0;
LAB_001273dd:
  pcVar2 = ctx->p;
  ctx->p = pcVar2 + 1;
  *pcVar2 = '\"';
  c = 0;
  pbVar4 = __src;
  do {
    if (count == 0) {
      bVar1 = true;
      count = 0xffffffffffffffff;
    }
    else {
      pbVar5 = pbVar4 + count;
      do {
        c = *pbVar4;
        bVar1 = false;
        if (((c < 0x20) || (c == 0x22)) || (c == 0x5c)) goto LAB_00127425;
        pbVar4 = pbVar4 + 1;
        count = count - 1;
      } while (count != 0);
      bVar1 = true;
      count = 0;
      pbVar4 = pbVar5;
LAB_00127425:
      count = count - 1;
    }
    __n_00 = (long)pbVar4 - (long)__src;
    pcVar2 = ctx->pflush;
    __dest = ctx->p;
    uVar3 = __n_00;
    if (__dest + __n_00 < pcVar2) {
      memcpy(__dest,__src,__n_00);
    }
    else {
      if (pcVar2 <= __dest) {
        (*ctx->flush)(ctx,0);
        pcVar2 = ctx->pflush;
        __dest = ctx->p;
      }
      __n = (long)pcVar2 - (long)__dest;
      pbVar5 = __src;
      if (__n < __n_00) {
        do {
          memcpy(__dest,pbVar5,__n);
          ctx->p = ctx->p + __n;
          pbVar5 = pbVar5 + __n;
          uVar3 = uVar3 - __n;
          (*ctx->flush)(ctx,0);
          __dest = ctx->p;
          __n = (long)ctx->pflush - (long)__dest;
        } while (__n < uVar3);
      }
      memcpy(__dest,pbVar5,uVar3);
    }
    pcVar2 = ctx->p;
    ctx->p = pcVar2 + uVar3;
    if (bVar1) {
      pcVar2 = pcVar2 + uVar3;
      ctx->p = pcVar2 + 1;
      *pcVar2 = '\"';
      return;
    }
    print_escape(ctx,c);
    pbVar4 = pbVar4 + 1;
    __src = __src + __n_00 + 1;
  } while( true );
}

Assistant:

void flatcc_json_printer_char_array_struct_field(
        flatcc_json_printer_t *ctx,
        int index, const void *p, size_t offset,
        const char *name, size_t len, size_t count)
{
    p = (void *)((size_t)p + offset);
    if (index) {
        print_char(',');
    }
    print_name(ctx, name, len);
    print_char_array(ctx, p, count);
}